

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.c
# Opt level: O1

int wally_sha256_midstate(uchar *bytes,size_t bytes_len,uchar *bytes_out,size_t len)

{
  uint uVar1;
  int iVar2;
  size_t i;
  long lVar3;
  sha256_ctx ctx;
  sha256_ctx local_88;
  
  iVar2 = -2;
  if ((len == 0x20 && bytes_out != (uchar *)0x0) && (bytes_len == 0 || bytes != (uchar *)0x0)) {
    sha256_init(&local_88);
    sha256_update(&local_88,bytes,bytes_len);
    lVar3 = 0;
    do {
      uVar1 = local_88.s[lVar3];
      *(uint *)(bytes_out + lVar3 * 4) =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 8);
    local_88.bytes = 0xffffffffffffffff;
    (*_ops.bzero_fn)(&local_88,0x68);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int wally_sha256_midstate(const unsigned char *bytes, size_t bytes_len,
                          unsigned char *bytes_out, size_t len)
{
    struct sha256 sha;
    struct sha256_ctx ctx;
    bool aligned = alignment_ok(bytes_out, sizeof(sha.u.u32));

    if ((!bytes && bytes_len != 0) || !bytes_out || len != SHA256_LEN)
        return WALLY_EINVAL;

    sha256_init(&ctx);
    sha256_update(&ctx, bytes, bytes_len);
    sha256_midstate(&ctx, aligned ? (struct sha256 *)bytes_out : &sha);
    wally_clear(&ctx, sizeof(ctx));

    if (!aligned) {
        memcpy(bytes_out, &sha, sizeof(sha));
        wally_clear(&sha, sizeof(sha));
    }
    return WALLY_OK;
}